

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
                 *this,GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  int iVar2;
  ImVec2 IVar3;
  ImPlotContext *pIVar4;
  int iVar5;
  ImPlotContext *gp;
  ImVec2 IVar6;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar5 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar5 = iVar2;
  }
  this->Prims = iVar5 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar4 = GImPlot;
  (this->P12).y = 0.0;
  uVar1 = *(unsigned_long_long *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride);
  iVar2 = transformer->YAxis;
  IVar6.x = (float)(((getter1->XScale * 0.0 + getter1->X0) - (GImPlot->CurrentPlot->XAxis).Range.Min
                    ) * GImPlot->Mx + (double)GImPlot->PixelRange[iVar2].Min.x);
  IVar6.y = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                    GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) * GImPlot->My[iVar2] +
                   (double)GImPlot->PixelRange[iVar2].Min.y);
  this->P11 = IVar6;
  iVar2 = transformer->YAxis;
  IVar3.y = (float)((getter2->YRef - pIVar4->CurrentPlot->YAxis[iVar2].Range.Min) *
                    pIVar4->My[iVar2] + (double)pIVar4->PixelRange[iVar2].Min.y);
  IVar3.x = (float)(((getter2->XScale * 0.0 + getter2->X0) - (pIVar4->CurrentPlot->XAxis).Range.Min)
                    * pIVar4->Mx + (double)pIVar4->PixelRange[iVar2].Min.x);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }